

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O2

void get_minimap_dimensions(term_conflict *t,chunk *c,wchar_t tw,wchar_t th,int *mw,int *mh)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  
  wVar4 = t->hgt + L'\xfffffffe';
  wVar5 = c->height;
  wVar3 = c->width;
  if (L'\x01' < th) {
    iVar2 = 0;
    if (0 < wVar5 % th) {
      iVar2 = th - wVar5 % th;
    }
    wVar5 = wVar5 + iVar2;
    wVar4 = wVar4 - wVar4 % th;
  }
  wVar1 = t->wid + L'\xfffffffe';
  if (L'\x01' < tw) {
    iVar2 = 0;
    if (0 < wVar3 % tw) {
      iVar2 = tw - wVar3 % tw;
    }
    wVar3 = wVar3 + iVar2;
    wVar1 = wVar1 - wVar1 % tw;
  }
  if (wVar4 < wVar5) {
    wVar5 = wVar4;
  }
  *mh = wVar5;
  if (wVar1 < wVar3) {
    wVar3 = wVar1;
  }
  *mw = wVar3;
  return;
}

Assistant:

static void get_minimap_dimensions(term *t, const struct chunk *c,
	int tw, int th, int *mw, int *mh)
{
	int map_height = t->hgt - 2;
	int map_width = t->wid - 2;
	int cave_height = c->height;
	int cave_width = c->width;
	int remainder;

	if (th > 1) {
		/*
		 * Round cave height up to a multiple of the tile height
		 * (ideally want no information truncated).
		 */
		remainder = cave_height % th;
		if (remainder > 0) {
			cave_height += th - remainder;
		}

		/*
		 * Round map height down to a multiple of the tile height
		 * (don't want partial tiles overwriting the map borders).
		 */
		map_height -= map_height % th;
	}
	if (tw > 1) {
		/* As above but for the width. */
		remainder = cave_width % tw;
		if (remainder > 0) {
			cave_width += tw - remainder;
		}
		map_width -= map_width % tw;
	}

	*mh = MIN(map_height, cave_height);
	*mw = MIN(map_width, cave_width);
}